

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O0

string * std::format<char_const*>(string_view fmt,char **ts)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  char *pcVar1;
  ulong uVar2;
  const_iterator pvVar3;
  reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  const_iterator pvVar7;
  undefined8 *in_RCX;
  string *in_RDI;
  stringstream ss;
  const_iterator frag;
  const_iterator parser;
  const_iterator start;
  size_t index;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  size_type in_stack_fffffffffffffb78;
  const_iterator pvVar8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  basic_string_view<char,_std::char_traits<char>_> *local_430;
  stringstream local_3f8 [392];
  const_iterator local_270;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  char *local_238;
  char *local_230;
  ulong local_228;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> local_220;
  undefined1 local_20 [32];
  
  local_20._0_8_ = in_RCX;
  memset(&local_220,0,0x200);
  local_430 = local_220._M_elems;
  do {
    webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_430);
    local_430 = local_430 + 1;
  } while (local_430 != (basic_string_view<char,_std::char_traits<char>_> *)local_20);
  local_228 = 0;
  local_238 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_20 + 8));
  local_230 = local_238;
  for (; pcVar6 = local_238,
      pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend
                         ((basic_string_view<char,_std::char_traits<char>_> *)(local_20 + 8)),
      pcVar1 = local_230, pcVar6 != pvVar3; local_238 = local_238 + 1) {
    if (*local_238 == '{') {
      pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                         ((basic_string_view<char,_std::char_traits<char>_> *)(local_20 + 8));
      uVar2 = local_228;
      if (pcVar1 == pvVar3) {
        webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_248,local_230,(long)local_238 - (long)local_230);
        local_228 = local_228 + 1;
        pvVar4 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::operator[]
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pvVar4->_M_len = local_248._M_len;
        pvVar4->_M_str = local_248._M_str;
      }
      else if ((local_230 != local_238) &&
              (sVar5 = webfront::http::std::
                       array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::size
                                 (&local_220), uVar2 < sVar5)) {
        webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_258,local_230 + 1,(long)local_238 - (long)(local_230 + 1));
        local_228 = local_228 + 1;
        pvVar4 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::operator[]
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pvVar4->_M_len = local_258._M_len;
        pvVar4->_M_str = local_258._M_str;
      }
    }
    else if (*local_238 == '}') {
      local_230 = local_238;
    }
  }
  pcVar6 = local_230 + 1;
  pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend
                     ((basic_string_view<char,_std::char_traits<char>_> *)(local_20 + 8));
  if (pcVar6 != pvVar3) {
    in_stack_fffffffffffffb88 = local_230 + 1;
    pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend
                       ((basic_string_view<char,_std::char_traits<char>_> *)(local_20 + 8));
    webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_268,in_stack_fffffffffffffb88,(long)pvVar3 - (long)(local_230 + 1));
    local_228 = local_228 + 1;
    pvVar4 = webfront::http::std::array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>
             ::operator[]((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                          in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    pvVar4->_M_len = local_268._M_len;
    pvVar4->_M_str = local_268._M_str;
  }
  local_270 = webfront::http::std::
              array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::cbegin
                        ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                         0x1410a6);
  std::__cxx11::stringstream::stringstream(local_3f8);
  local_270 = local_270 + 1;
  __str._M_str = pcVar6;
  __str._M_len = (size_t)in_stack_fffffffffffffb88;
  __os = operator<<(in_stack_fffffffffffffb80,__str);
  std::operator<<(__os,*(char **)local_20._0_8_);
  while (pvVar8 = local_270,
        pvVar7 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::cend
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            0x141133), pvVar8 != pvVar7) {
    local_270 = local_270 + 1;
    __str_00._M_str = pcVar6;
    __str_00._M_len = (size_t)in_stack_fffffffffffffb88;
    operator<<(__os,__str_00);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3f8);
  return in_RDI;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}